

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.hpp
# Opt level: O2

ray<double> * __thiscall
camera<double>::getRay(ray<double> *__return_storage_ptr__,camera<double> *this,double *s,double *t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double local_40;
  double local_38;
  
  random_disk_hat<double>();
  dVar7 = local_40 * this->r_;
  dVar14 = this->r_ * local_38;
  dVar18 = (this->v).e[2] * dVar14 + (this->u).e[2] * dVar7;
  dVar1 = *s;
  dVar2 = (this->hor_).e[2];
  dVar3 = (this->llc_).e[2];
  dVar4 = (this->o_).e[2];
  dVar5 = *t;
  dVar6 = (this->ver_).e[2];
  dVar15 = dVar14 * (this->v).e[0] + dVar7 * (this->u).e[0];
  dVar17 = dVar14 * (this->v).e[1] + dVar7 * (this->u).e[1];
  dVar7 = (this->o_).e[0];
  dVar14 = (this->o_).e[1];
  dVar8 = (this->hor_).e[0];
  dVar9 = (this->hor_).e[1];
  dVar10 = (this->llc_).e[0];
  dVar11 = (this->llc_).e[1];
  dVar12 = (this->ver_).e[0];
  dVar13 = (this->ver_).e[1];
  dVar16 = random_double(&this->t0_,&this->t1_);
  (__return_storage_ptr__->o_).e[0] = dVar15 + dVar7;
  (__return_storage_ptr__->o_).e[1] = dVar17 + dVar14;
  (__return_storage_ptr__->o_).e[2] = dVar18 + dVar4;
  (__return_storage_ptr__->dir_).e[0] = ((dVar5 * dVar12 + dVar10 + dVar1 * dVar8) - dVar7) - dVar15
  ;
  (__return_storage_ptr__->dir_).e[1] =
       ((dVar5 * dVar13 + dVar11 + dVar1 * dVar9) - dVar14) - dVar17;
  (__return_storage_ptr__->dir_).e[2] = ((dVar6 * dVar5 + dVar2 * dVar1 + dVar3) - dVar4) - dVar18;
  __return_storage_ptr__->time_ = dVar16;
  return __return_storage_ptr__;
}

Assistant:

ray<T> getRay(const T& s, const T& t) const {
    vec3<T> rd = r_ * random_disk_hat<T>();
    vec3<T> off = u * rd.getX() + v * rd.getY();

    return ray<T>(o_ + off, llc_ + s * hor_ + t * ver_ - o_ - off,
                  random_double(t0_, t1_));
    // return ray<T>(o_, llc_ + s * hor_ + t * ver_ - o_);
  }